

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

token_type __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::input_stream_adapter>
::scan(lexer<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::input_stream_adapter>
       *this)

{
  int iVar1;
  bool bVar2;
  token_type tVar3;
  size_t length;
  array<char,_5UL> *literal_text;
  array<char,_4UL> null_literal;
  array<char,_4UL> true_literal;
  array<char,_5UL> false_literal;
  
  if (((this->position).chars_read_total == 0) && (bVar2 = skip_bom(this), !bVar2)) {
    this->error_message = "invalid BOM; must be 0xEF 0xBB 0xBF if given";
    return parse_error;
  }
  skip_whitespace(this);
  tVar3 = parse_error;
  while ((iVar1 = this->current, this->ignore_comments == true && (iVar1 == 0x2f))) {
    bVar2 = scan_comment(this);
    if (!bVar2) {
      return parse_error;
    }
    skip_whitespace(this);
  }
  switch(iVar1) {
  case 0x22:
    tVar3 = scan_string(this);
    return tVar3;
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2e:
  case 0x2f:
switchD_001682c5_caseD_23:
    this->error_message = "invalid literal";
    break;
  case 0x2c:
    tVar3 = value_separator;
    break;
  case 0x2d:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    tVar3 = scan_number(this);
    return tVar3;
  case 0x3a:
    tVar3 = name_separator;
    break;
  default:
    if (iVar1 + 1U < 2) {
      return end_of_input;
    }
    if (iVar1 == 0x5b) {
      return begin_array;
    }
    if (iVar1 == 0x7d) {
      return end_object;
    }
    if (iVar1 == 0x66) {
      literal_text = &false_literal;
      builtin_strncpy(false_literal._M_elems,"false",5);
      length = 5;
      tVar3 = literal_false;
    }
    else if (iVar1 == 0x6e) {
      literal_text = (array<char,_5UL> *)&null_literal;
      builtin_strncpy(null_literal._M_elems,"null",4);
      length = 4;
      tVar3 = literal_null;
    }
    else {
      if (iVar1 != 0x74) {
        if (iVar1 == 0x7b) {
          return begin_object;
        }
        if (iVar1 == 0x5d) {
          return end_array;
        }
        goto switchD_001682c5_caseD_23;
      }
      literal_text = (array<char,_5UL> *)&true_literal;
      builtin_strncpy(true_literal._M_elems,"true",4);
      length = 4;
      tVar3 = literal_true;
    }
    tVar3 = scan_literal(this,literal_text->_M_elems,length,tVar3);
  }
  return tVar3;
}

Assistant:

token_type scan()
    {
        // initially, skip the BOM
        if (position.chars_read_total == 0 && !skip_bom())
        {
            error_message = "invalid BOM; must be 0xEF 0xBB 0xBF if given";
            return token_type::parse_error;
        }

        // read next character and ignore whitespace
        skip_whitespace();

        // ignore comments
        while (ignore_comments && current == '/')
        {
            if (!scan_comment())
            {
                return token_type::parse_error;
            }

            // skip following whitespace
            skip_whitespace();
        }

        switch (current)
        {
            // structural characters
            case '[':
                return token_type::begin_array;
            case ']':
                return token_type::end_array;
            case '{':
                return token_type::begin_object;
            case '}':
                return token_type::end_object;
            case ':':
                return token_type::name_separator;
            case ',':
                return token_type::value_separator;

            // literals
            case 't':
            {
                std::array<char_type, 4> true_literal = {{char_type('t'), char_type('r'), char_type('u'), char_type('e')}};
                return scan_literal(true_literal.data(), true_literal.size(), token_type::literal_true);
            }
            case 'f':
            {
                std::array<char_type, 5> false_literal = {{char_type('f'), char_type('a'), char_type('l'), char_type('s'), char_type('e')}};
                return scan_literal(false_literal.data(), false_literal.size(), token_type::literal_false);
            }
            case 'n':
            {
                std::array<char_type, 4> null_literal = {{char_type('n'), char_type('u'), char_type('l'), char_type('l')}};
                return scan_literal(null_literal.data(), null_literal.size(), token_type::literal_null);
            }

            // string
            case '\"':
                return scan_string();

            // number
            case '-':
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
                return scan_number();

            // end of input (the null byte is needed when parsing from
            // string literals)
            case '\0':
            case std::char_traits<char_type>::eof():
                return token_type::end_of_input;

            // error
            default:
                error_message = "invalid literal";
                return token_type::parse_error;
        }
    }